

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::readRgba(RgbaInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Header *pHVar4;
  Compression *pCVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  iVar1 = Imf_3_2::RgbaInputFile::parts();
  iVar10 = 0;
  if (0 < iVar1) {
    do {
      Imf_3_2::RgbaInputFile::setPart((int)in);
      piVar3 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
      iVar1 = piVar3[2];
      iVar2 = *piVar3;
      pHVar4 = (Header *)Imf_3_2::RgbaInputFile::header();
      Imf_3_2::calculateBytesPerPixel(pHVar4);
      Imf_3_2::RgbaInputFile::header();
      pCVar5 = (Compression *)Imf_3_2::Header::compression();
      Imf_3_2::numLinesInBuffer(*pCVar5);
      uVar9 = ((long)iVar1 - (long)iVar2) + 1;
      pvVar6 = operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
      Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)in,(ulong)((long)pvVar6 + (long)iVar2 * -8),1);
      if (reduceMemory) {
        iVar2 = piVar3[3];
        iVar1 = piVar3[1];
        iVar7 = (iVar2 - iVar1) + 1;
        iVar8 = iVar7 >> 0x14;
        iVar7 = (int)((ulong)((long)((piVar3[2] - *piVar3) + 1) * (long)iVar7) >> 0x1c);
        if (iVar8 <= iVar7) {
          iVar8 = iVar7;
        }
        if (iVar8 < 2) {
          iVar8 = 1;
        }
      }
      else {
        iVar1 = piVar3[1];
        iVar2 = piVar3[3];
        iVar8 = 1;
      }
      if (iVar1 <= iVar2) {
        do {
          Imf_3_2::RgbaInputFile::readPixels((int)in);
          iVar1 = iVar1 + iVar8;
        } while (iVar1 <= piVar3[3]);
      }
      operator_delete__(pvVar6);
      iVar10 = iVar10 + 1;
      iVar1 = Imf_3_2::RgbaInputFile::parts();
    } while (iVar10 < iVar1);
  }
  return false;
}

Assistant:

bool
readRgba (RgbaInputFile& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;

    for (int part = 0; part < in.parts (); ++part)
    {
        in.setPart (part);
        try
        {
            const Box2i& dw = in.dataWindow ();

            uint64_t w = static_cast<uint64_t> (dw.max.x) -
                         static_cast<uint64_t> (dw.min.x) + 1;
            int      dx            = dw.min.x;
            uint64_t bytesPerPixel = calculateBytesPerPixel (in.header ());
            uint64_t numLines = numLinesInBuffer (in.header ().compression ());

            if (reduceMemory &&
                w * bytesPerPixel * numLines > gMaxBytesPerScanline)
            {
                return false;
            }

            Array<Rgba> pixels (w);
            intptr_t    base = reinterpret_cast<intptr_t> (&pixels[0]);
            in.setFrameBuffer (
                reinterpret_cast<Rgba*> (base - dx * sizeof (Rgba)), 1, 0);

            int step = getStep (dw, reduceTime);

            //
            // try reading scanlines. Continue reading scanlines
            // even if an exception is encountered
            //
            for (int y = dw.min.y; y <= dw.max.y; y += step)
            {
                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;

                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
        catch (...)
        {
            threw = true;
        }
    }
    return threw;
}